

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration_p.h
# Opt level: O2

void __thiscall
QEglFSDeviceIntegrationPlugin::QEglFSDeviceIntegrationPlugin(QEglFSDeviceIntegrationPlugin *this)

{
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined8 *)this = 0x1082f8;
  return;
}

Assistant:

class Q_EGLFS_EXPORT QEglFSDeviceIntegrationPlugin : public QObject
{
    Q_OBJECT

public:
    virtual QEglFSDeviceIntegration *create() = 0;

    // the pattern expected by qLoadPlugin calls for a QString argument.
    // we don't need it, so don't bother subclasses with it:
    QEglFSDeviceIntegration *create(const QString &) { return create(); }
}